

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

String * __thiscall GEO::String::to_string<int>(String *this,int *value)

{
  _Setprecision _Var1;
  ostringstream local_190 [8];
  ostringstream out;
  int *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  _Var1 = std::setprecision(0x11);
  std::operator<<((ostream *)local_190,_Var1);
  std::ostream::operator<<((ostream *)local_190,*value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

inline std::string to_string(const T& value) {
            std::ostringstream out;
	    // Makes sure that double-precision number are displayed
	    // with a sufficient number of digits. This is important
	    // to avoid losing precision when using ASCII files.
	    out << std::setprecision(17);
            out << value;
            return out.str();
        }